

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_portability_unit.c
# Opt level: O2

void test_deserialize(char *filename)

{
  int iVar1;
  FILE *pFVar2;
  size_t __size;
  char *buf;
  size_t b;
  roaring_bitmap_t *r;
  size_t a;
  unsigned_long uVar3;
  char *buf_00;
  size_t a_00;
  size_t i;
  size_t sVar4;
  
  pFVar2 = fopen(filename,"rb");
  _assert_true((unsigned_long)pFVar2,"fp",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/format_portability_unit.c"
               ,0x1c);
  sVar4 = 0;
  iVar1 = fseek(pFVar2,0,2);
  _assert_int_not_equal
            ((long)iVar1,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/format_portability_unit.c"
             ,0x1e);
  __size = ftell(pFVar2);
  buf = (char *)malloc(__size);
  _assert_true((unsigned_long)buf,"buf",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/format_portability_unit.c"
               ,0x22);
  rewind(pFVar2);
  b = fread(buf,1,__size,pFVar2);
  _assert_int_equal(__size,b,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/format_portability_unit.c"
                    ,0x25);
  fclose(pFVar2);
  _assert_true((unsigned_long)buf,"input_buffer",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/format_portability_unit.c"
               ,0x36);
  r = roaring_bitmap_portable_deserialize(buf);
  _assert_true((unsigned_long)r,"bitmap",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/format_portability_unit.c"
               ,0x3a);
  a = roaring_bitmap_portable_size_in_bytes(r);
  pFVar2 = fopen(filename,"rb");
  _assert_true((unsigned_long)pFVar2,"fp",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/format_portability_unit.c"
               ,0x13);
  iVar1 = fseek(pFVar2,0,2);
  _assert_int_not_equal
            ((long)iVar1,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/format_portability_unit.c"
             ,0x15);
  uVar3 = ftell(pFVar2);
  _assert_int_equal(a,uVar3,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/format_portability_unit.c"
                    ,0x3e);
  buf_00 = (char *)malloc(a);
  a_00 = roaring_bitmap_portable_serialize(r,buf_00);
  _assert_int_equal(a_00,a,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/format_portability_unit.c"
                    ,0x44);
  do {
    if (a_00 == sVar4) {
      uVar3 = 1;
LAB_0010293d:
      _assert_true(uVar3,"compare(input_buffer, output_buffer, actual_size)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/format_portability_unit.c"
                   ,0x45);
      free(buf_00);
      free(buf);
      roaring_bitmap_free(r);
      return;
    }
    if (buf[sVar4] != buf_00[sVar4]) {
      uVar3 = (unsigned_long)((int)sVar4 == -1);
      goto LAB_0010293d;
    }
    sVar4 = sVar4 + 1;
  } while( true );
}

Assistant:

static inline void test_deserialize(char* filename) {
    char* input_buffer = readfile(filename);
    assert_non_null(input_buffer);

    roaring_bitmap_t* bitmap =
        roaring_bitmap_portable_deserialize(input_buffer);
    assert_non_null(bitmap);

    size_t expected_size = roaring_bitmap_portable_size_in_bytes(bitmap);

    assert_int_equal(expected_size, filesize(filename));

    char* output_buffer = (char*)malloc(expected_size);
    size_t actual_size =
        roaring_bitmap_portable_serialize(bitmap, output_buffer);

    assert_int_equal(actual_size, expected_size);
    assert_false(compare(input_buffer, output_buffer, actual_size));

    free(output_buffer);
    free(input_buffer);
    roaring_bitmap_free(bitmap);
}